

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::OsqpTest_GetAndUpdateRho_Test::~OsqpTest_GetAndUpdateRho_Test
          (OsqpTest_GetAndUpdateRho_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, GetAndUpdateRho) {
  OsqpSettings settings;
  settings.rho = 3.0e-3;

  OsqpSolver solver;
  ASSERT_TRUE(solver.Init(GetToyProblem(), settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  {
    const auto rho = solver.GetRho();
    ASSERT_TRUE(rho.ok());
    EXPECT_EQ(*rho, 3.0e-3);
  }

  ASSERT_TRUE(solver.UpdateRho(4.0e-4).ok());
  {
    const auto rho = solver.GetRho();
    ASSERT_TRUE(rho.ok());
    EXPECT_EQ(*rho, 4.0e-4);
  }
}